

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

bool anon_unknown.dwarf_104b6::CheckConsume(ParseContext *ctx,LexemeType type,char *msg,...)

{
  Lexeme *pLVar1;
  char in_AL;
  bool bVar2;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [24];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  Lexeme *local_50;
  Lexeme *curr;
  va_list args;
  char *msg_local;
  LexemeType type_local;
  ParseContext *ctx_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  bVar2 = ParseContext::Consume(ctx,type);
  if (!bVar2) {
    args[0].overflow_arg_area = local_108;
    args[0]._0_8_ = &stack0x00000008;
    curr._4_4_ = 0x30;
    curr._0_4_ = 0x18;
    pLVar3 = ParseContext::Current(ctx);
    local_50 = pLVar3;
    pLVar4 = ParseContext::Last(ctx);
    pLVar1 = local_50;
    if ((pLVar3 == pLVar4) && (pLVar3 = ParseContext::First(ctx), pLVar1 != pLVar3)) {
      ReportAt(ctx,local_50 + -1,local_50 + -1,local_50[-1].pos + local_50[-1].length,msg,
               (__va_list_tag *)&curr);
    }
    else {
      ReportAt(ctx,local_50,local_50,local_50->pos,msg,(__va_list_tag *)&curr);
    }
    return false;
  }
  return true;
}

Assistant:

bool CheckConsume(ParseContext &ctx, LexemeType type, const char *msg, ...)
	{
		if(!ctx.Consume(type))
		{
			va_list args;
			va_start(args, msg);

			Lexeme *curr = ctx.Current();

			if(curr == ctx.Last() && curr != ctx.First())
				ReportAt(ctx, curr - 1, curr - 1, (curr - 1)->pos + (curr - 1)->length, msg, args);
			else
				ReportAt(ctx, curr, curr, curr->pos, msg, args);

			va_end(args);

			return false;
		}

		return true;
	}